

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-poll.c
# Opt level: O1

uv_os_sock_t create_bound_socket(sockaddr_in bind_addr)

{
  long ******pppppplVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  uv_os_sock_t extraout_EAX;
  uv_os_sock_t extraout_EAX_00;
  uv_os_sock_t extraout_EAX_01;
  uv_os_sock_t extraout_EAX_02;
  connection_context_t *pcVar5;
  long ******pppppplVar6;
  undefined8 uVar7;
  ssize_t sVar8;
  int *piVar9;
  uint extraout_EDX;
  uint uVar10;
  code *__n;
  char *pcVar11;
  undefined4 uVar12;
  long *plVar13;
  code **ppcVar14;
  long *****ppppplVar15;
  long ******pppppplVar16;
  long ******pppppplVar17;
  int64_t eval_b;
  int64_t eval_a;
  int yes;
  code *pcStack_108;
  undefined8 uStack_100;
  long lStack_f8;
  long *****ppppplStack_f0;
  code *pcStack_e8;
  long *****ppppplStack_e0;
  long *****ppppplStack_d8;
  long *****ppppplStack_d0;
  long *****ppppplStack_c8;
  undefined8 uStack_98;
  long ****pppplStack_90;
  long *****ppppplStack_88;
  undefined8 uStack_68;
  long lStack_60;
  socklen_t sStack_54;
  sockaddr sStack_50;
  code *pcStack_40;
  undefined8 local_30;
  long local_28;
  undefined4 local_1c;
  sockaddr local_18;
  
  pcStack_40 = (code *)0x1b5fb9;
  uVar2 = socket(2,1,0);
  local_28 = (long)(int)uVar2;
  local_30 = 0;
  if (local_28 < 0) {
    pcStack_40 = (code *)0x1b6059;
    create_bound_socket_cold_3();
LAB_001b6059:
    pcStack_40 = (code *)0x1b6068;
    create_bound_socket_cold_1();
  }
  else {
    local_1c = 1;
    pcStack_40 = (code *)0x1b5ff9;
    iVar3 = setsockopt(uVar2,1,2,&local_1c,4);
    local_28 = (long)iVar3;
    local_30 = 0;
    if (local_28 != 0) goto LAB_001b6059;
    pcStack_40 = (code *)0x1b6026;
    iVar3 = bind(uVar2,&local_18,0x10);
    local_28 = (long)iVar3;
    local_30 = 0;
    if (local_28 == 0) {
      return uVar2;
    }
  }
  plVar13 = &local_28;
  pcStack_40 = server_poll_cb;
  create_bound_socket_cold_2();
  __n = (code *)*plVar13;
  sStack_54 = 0x10;
  pcStack_40 = (code *)(ulong)uVar2;
  iVar3 = accept(*(int *)((long)__n + 0x80),&sStack_50,&sStack_54);
  lStack_60 = (long)iVar3;
  uStack_68 = 0;
  if (lStack_60 < 0) {
    server_poll_cb_cold_2();
  }
  else {
    pcVar5 = create_connection_context(iVar3,1);
    pcVar5->events = 7;
    iVar3 = uv_poll_start(pcVar5,7,connection_poll_cb);
    lStack_60 = (long)iVar3;
    uStack_68 = 0;
    if (lStack_60 == 0) {
      iVar3 = *(int *)((long)__n + 0x84) + 1;
      *(int *)((long)__n + 0x84) = iVar3;
      if (iVar3 == 5) {
        close_socket(*(uv_os_sock_t *)((long)__n + 0x80));
        iVar3 = uv_close(__n,server_close_cb);
      }
      return iVar3;
    }
  }
  plVar13 = &lStack_60;
  uVar12 = SUB84(&uStack_68,0);
  server_poll_cb_cold_1();
  iVar3 = (int)&uStack_98;
  ppppplStack_88 = (long *****)__n;
  pppppplVar6 = (long ******)malloc(0x130);
  if (pppppplVar6 == (long ******)0x0) {
    create_connection_context_cold_3();
LAB_001b6216:
    create_connection_context_cold_1();
  }
  else {
    *(int *)(pppppplVar6 + 0x1f) = (int)plVar13;
    *(undefined4 *)(pppppplVar6 + 0x22) = uVar12;
    pppppplVar6[0x20] = (long *****)0x0;
    pppppplVar6[0x21] = (long *****)0x0;
    *(undefined8 *)((long)pppppplVar6 + 0x114) = 0;
    *(undefined8 *)((long)pppppplVar6 + 0x11c) = 0;
    *(undefined8 *)((long)pppppplVar6 + 0x124) = 0;
    uVar7 = uv_default_loop();
    iVar4 = uv_poll_init(uVar7,pppppplVar6,(ulong)plVar13 & 0xffffffff);
    *(int *)((long)pppppplVar6 + 0x114) = *(int *)((long)pppppplVar6 + 0x114) + 1;
    *pppppplVar6 = (long *****)pppppplVar6;
    pppplStack_90 = (long ****)(long)iVar4;
    uStack_98 = 0;
    __n = (code *)pppppplVar6;
    if ((long *****)pppplStack_90 != (long *****)0x0) goto LAB_001b6216;
    uVar7 = uv_default_loop();
    iVar4 = uv_timer_init(uVar7,pppppplVar6 + 0x10);
    *(int *)((long)pppppplVar6 + 0x114) = *(int *)((long)pppppplVar6 + 0x114) + 1;
    pppppplVar6[0x10] = (long *****)pppppplVar6;
    pppplStack_90 = (long ****)(long)iVar4;
    uStack_98 = 0;
    if ((long *****)pppplStack_90 == (long *****)0x0) {
      return (uv_os_sock_t)pppppplVar6;
    }
  }
  pppppplVar6 = (long ******)&pppplStack_90;
  create_connection_context_cold_2();
  pppppplVar1 = (long ******)*pppppplVar6;
  ppppplStack_d8 = (long *****)(long)iVar3;
  ppppplStack_e0 = (long *****)0x0;
  ppppplStack_c8 = (long *****)__n;
  if ((long ******)ppppplStack_d8 == (long ******)0x0) {
    uVar2 = *(uint *)((long)pppppplVar1 + 0x124);
    if ((uVar2 & extraout_EDX) == 0) goto LAB_001b68d6;
    if ((~uVar2 & extraout_EDX) == 0) {
      pppppplVar16 = pppppplVar6;
      if ((extraout_EDX & 1) != 0) goto LAB_001b63cb;
switchD_001b640c_caseD_4:
      if ((extraout_EDX & 2) != 0) {
        if ((pppppplVar1[0x21] < (long *****)0x10000) &&
           ((test_mode != '\x01' || (*(int *)(pppppplVar1 + 0x22) == 0)))) {
          pcStack_e8 = (code *)0x1b64ac;
          iVar3 = rand();
          pcVar11 = (char *)__n;
          switch(iVar3 % 7) {
          case 0:
          case 1:
            pppppplVar17 = (long ******)0x67;
            if ((long ******)(0x10000 - (long)pppppplVar1[0x21]) < (long ******)0x67) {
              pppppplVar17 = (long ******)(0x10000 - (long)pppppplVar1[0x21]);
            }
            ppppplStack_e0 = (long *****)0x0;
            ppppplStack_d8 = (long *****)pppppplVar17;
            ppppplStack_d0 = (long *****)pppppplVar16;
            if ((long)pppppplVar17 < 1) goto LAB_001b6919;
            do {
              pppppplVar6 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
              pcStack_e8 = (code *)0x1b6540;
              pcVar11 = (char *)send(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_2,
                                     (size_t)pppppplVar17,0);
              uVar10 = (uint)pcVar11;
              if (uVar10 != 0xffffffff) break;
              pcStack_e8 = (code *)0x1b654d;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            pppppplVar16 = (long ******)ppppplStack_d0;
            if ((int)uVar10 < 0) {
              pcStack_e8 = (code *)0x1b6845;
              piVar9 = __errno_location();
              __n = (code *)pcVar11;
              if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                pcStack_e8 = (code *)0x1b6856;
                connection_poll_cb_cold_15();
                goto LAB_001b6856;
              }
LAB_001b6870:
              spurious_writable_wakeups = spurious_writable_wakeups + 1;
            }
            else {
              __n = (code *)(ulong)(uVar10 & 0x7fffffff);
              ppppplStack_e0 = (long *****)0x0;
              ppppplStack_d8 = (long *****)__n;
              if ((long ******)__n == (long ******)0x0) goto LAB_001b6933;
              pppppplVar1[0x21] = (long *****)((long)pppppplVar1[0x21] + (long)__n);
              valid_writable_wakeups = valid_writable_wakeups + 1;
            }
            break;
          case 2:
          case 3:
            pppppplVar17 = (long ******)(0x10000 - (long)pppppplVar1[0x21]);
            if ((long ******)0x4d1 < pppppplVar17) {
              pppppplVar17 = (long ******)0x4d2;
            }
            ppppplStack_e0 = (long *****)0x0;
            ppppplStack_d8 = (long *****)pppppplVar17;
            ppppplStack_d0 = (long *****)pppppplVar16;
            if ((long)pppppplVar17 < 1) goto LAB_001b6926;
            pcVar11 = connection_poll_cb::buffer_3;
            do {
              pppppplVar6 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
              pcStack_e8 = (code *)0x1b66bb;
              sVar8 = send(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_3,
                           (size_t)pppppplVar17,0);
              uVar10 = (uint)sVar8;
              if (uVar10 != 0xffffffff) break;
              pcStack_e8 = (code *)0x1b66c9;
              piVar9 = __errno_location();
            } while (*piVar9 == 4);
            if ((int)uVar10 < 0) {
LAB_001b6856:
              pcStack_e8 = (code *)0x1b685b;
              piVar9 = __errno_location();
              __n = (code *)pcVar11;
              pppppplVar16 = (long ******)ppppplStack_d0;
              if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto LAB_001b6870;
              goto LAB_001b6952;
            }
            ppppplStack_d8 = (long *****)(ulong)(uVar10 & 0x7fffffff);
            ppppplStack_e0 = (long *****)0x0;
            __n = (code *)pcVar11;
            if ((long ******)ppppplStack_d8 == (long ******)0x0) goto LAB_001b6940;
            valid_writable_wakeups = valid_writable_wakeups + 1;
            ppppplVar15 = (long *****)((long)ppppplStack_d8 + (long)pppppplVar1[0x21]);
            pppppplVar1[0x21] = ppppplVar15;
            while (pppppplVar16 = (long ******)ppppplStack_d0, ppppplVar15 < (long *****)0x10000) {
              __n = (code *)(0x10000 - (long)ppppplVar15);
              if (ppppplVar15 < (long *****)0xfb2f) {
                __n = (code *)0x4d2;
              }
              ppppplStack_e0 = (long *****)0x0;
              ppppplStack_d8 = (long *****)__n;
              if ((long)__n < 1) goto LAB_001b68fa;
              do {
                pcStack_e8 = (code *)0x1b676f;
                sVar8 = send(*(int *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_3,(size_t)__n,0
                            );
                uVar10 = (uint)sVar8;
                if (uVar10 != 0xffffffff) break;
                pcStack_e8 = (code *)0x1b677d;
                piVar9 = __errno_location();
              } while (*piVar9 == 4);
              if (uVar10 == 0) {
LAB_001b68c4:
                pcStack_e8 = (code *)0x1b68c9;
                connection_poll_cb_cold_10();
                goto LAB_001b68c9;
              }
              if ((int)uVar10 < 0) {
                pcStack_e8 = (code *)0x1b68a6;
                piVar9 = __errno_location();
                pppppplVar16 = (long ******)ppppplStack_d0;
                if ((*piVar9 != 0xb) && (*piVar9 != 0x73)) {
                  pcStack_e8 = (code *)0x1b68c4;
                  connection_poll_cb_cold_11();
                  goto LAB_001b68c4;
                }
                break;
              }
              ppppplVar15 = (long *****)((ulong)(uVar10 & 0x7fffffff) + (long)pppppplVar1[0x21]);
              pppppplVar1[0x21] = ppppplVar15;
            }
            break;
          case 4:
            break;
          case 5:
            uVar2 = uVar2 & 0xfffffffd;
            __n = (code *)(pppppplVar1 + 0x10);
            pcStack_e8 = (code *)0x1b67f8;
            iVar3 = uv_is_active(__n);
            if (iVar3 == 0) {
              *(undefined4 *)(pppppplVar1 + 0x25) = 2;
              pcStack_e8 = (code *)0x1b689c;
              uv_timer_start(__n,delay_timer_cb,100,0);
            }
            else {
              *(byte *)(pppppplVar1 + 0x25) = (byte)*(code *)(pppppplVar1 + 0x25) | 2;
            }
            break;
          case 6:
            __n = connection_poll_cb;
            pcStack_e8 = (code *)0x1b6820;
            uv_poll_start(pppppplVar1,1,connection_poll_cb);
            pcStack_e8 = (code *)0x1b6830;
            uv_poll_start(pppppplVar1,2,connection_poll_cb);
            *(undefined4 *)((long)pppppplVar1 + 0x124) = 2;
            break;
          default:
            goto switchD_001b64e8_default;
          }
        }
        else {
          pcStack_e8 = (code *)0x1b62cb;
          iVar3 = shutdown(*(int *)(pppppplVar1 + 0x1f),1);
          ppppplStack_d8 = (long *****)(long)iVar3;
          ppppplStack_e0 = (long *****)0x0;
          if ((long ******)ppppplStack_d8 != (long ******)0x0) goto LAB_001b68ed;
          *(undefined4 *)((long)pppppplVar1 + 0x11c) = 1;
          uVar2 = uVar2 & 0xfffffffd;
          ppppplStack_d8 = (long *****)(long ******)0x0;
        }
      }
      if ((extraout_EDX & 4) != 0) {
        *(undefined4 *)(pppppplVar1 + 0x24) = 1;
        disconnects = disconnects + 1;
        uVar2 = uVar2 & 0xfffffffb;
      }
      if (((*(int *)(pppppplVar1 + 0x23) == 0) || (*(int *)((long)pppppplVar1 + 0x11c) == 0)) ||
         (*(int *)(pppppplVar1 + 0x24) == 0)) {
        if (uVar2 != *(uint *)((long)pppppplVar1 + 0x124)) {
          *(uint *)((long)pppppplVar1 + 0x124) = uVar2;
          pcStack_e8 = (code *)0x1b638a;
          uv_poll_start(pppppplVar16,uVar2,connection_poll_cb);
        }
      }
      else {
        pcStack_e8 = (code *)0x1b633b;
        close_socket(*(uv_os_sock_t *)(pppppplVar1 + 0x1f));
        __n = connection_close_cb;
        pcStack_e8 = (code *)0x1b634d;
        uv_close(pppppplVar1,connection_close_cb);
        pcStack_e8 = (code *)0x1b635c;
        uv_close(pppppplVar1 + 0x10,connection_close_cb);
        *(undefined4 *)((long)pppppplVar1 + 0x124) = 0;
      }
      if (*(int *)((long)pppppplVar1 + 0x124) == 0) {
        pcStack_e8 = (code *)0x1b647a;
        iVar3 = uv_is_active(pppppplVar16);
        ppppplStack_d8 = (long *****)(long)iVar3;
        ppppplStack_e0 = (long *****)0x0;
        if ((long ******)ppppplStack_d8 == (long ******)0x0) {
LAB_001b6498:
          return (uv_os_sock_t)ppppplStack_d8;
        }
        goto LAB_001b68e0;
      }
      ppppplStack_d8 = (long *****)0x1;
      pcStack_e8 = (code *)0x1b63a9;
      iVar3 = uv_is_active(pppppplVar16);
      ppppplStack_e0 = (long *****)(long)iVar3;
      if (ppppplStack_d8 == ppppplStack_e0) goto LAB_001b6498;
      pppppplVar6 = &ppppplStack_d8;
      pcStack_e8 = (code *)0x1b63cb;
      connection_poll_cb_cold_17();
LAB_001b63cb:
      pcStack_e8 = (code *)0x1b63d0;
      iVar3 = rand();
      switch(iVar3 % 7) {
      case 0:
      case 1:
        do {
          pppppplVar6 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
          pcStack_e8 = (code *)0x1b642b;
          sVar8 = recv(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer,0x4a,0);
          iVar3 = (int)sVar8;
          if (iVar3 != -1) break;
          pcStack_e8 = (code *)0x1b6439;
          piVar9 = __errno_location();
        } while (*piVar9 == 4);
        ppppplStack_d8 = (long *****)(long)iVar3;
        ppppplStack_e0 = (long *****)0x0;
        __n = (code *)connection_poll_cb::buffer;
        if ((long)ppppplStack_d8 < 0) goto LAB_001b6907;
        if (iVar3 < 1) goto LAB_001b65f5;
        pppppplVar1[0x20] = (long *****)((long)pppppplVar1[0x20] + (long)ppppplStack_d8);
        goto switchD_001b640c_caseD_4;
      case 2:
      case 3:
LAB_001b659a:
        pppppplVar6 = (long ******)(ulong)*(uint *)(pppppplVar1 + 0x1f);
        pcStack_e8 = (code *)0x1b65b0;
        __n = (code *)recv(*(uint *)(pppppplVar1 + 0x1f),connection_poll_cb::buffer_1,0x3a3,0);
        uVar10 = (uint)__n;
        if (uVar10 == 0xffffffff) goto code_r0x001b65b8;
        goto LAB_001b65c2;
      case 4:
        goto switchD_001b640c_caseD_4;
      case 5:
        uVar2 = uVar2 & 0xfffffffe;
        __n = (code *)(pppppplVar1 + 0x10);
        pcStack_e8 = (code *)0x1b661a;
        pppppplVar6 = (long ******)__n;
        iVar3 = uv_is_active();
        if (iVar3 == 0) {
          *(undefined4 *)(pppppplVar1 + 0x25) = 1;
          pcStack_e8 = (code *)0x1b67e1;
          pppppplVar6 = (long ******)__n;
          uv_timer_start(__n,delay_timer_cb,10,0);
        }
        else {
          *(byte *)(pppppplVar1 + 0x25) = (byte)*(code *)(pppppplVar1 + 0x25) | 1;
        }
        goto switchD_001b640c_caseD_4;
      case 6:
        __n = connection_poll_cb;
        pcStack_e8 = (code *)0x1b6646;
        uv_poll_start(pppppplVar1,2,connection_poll_cb);
        pcStack_e8 = (code *)0x1b6656;
        pppppplVar6 = pppppplVar1;
        uv_poll_start(pppppplVar1,1,connection_poll_cb);
        *(undefined4 *)((long)pppppplVar1 + 0x124) = 1;
        goto switchD_001b640c_caseD_4;
      default:
        goto switchD_001b640c_default;
      }
    }
  }
  else {
LAB_001b68c9:
    pcStack_e8 = (code *)0x1b68d6;
    connection_poll_cb_cold_1();
LAB_001b68d6:
    pcStack_e8 = (code *)0x1b68db;
    connection_poll_cb_cold_19();
  }
  pcStack_e8 = (code *)0x1b68e0;
  connection_poll_cb_cold_2();
LAB_001b68e0:
  pcStack_e8 = (code *)0x1b68ed;
  connection_poll_cb_cold_18();
LAB_001b68ed:
  pcStack_e8 = (code *)0x1b68fa;
  connection_poll_cb_cold_6();
LAB_001b68fa:
  pcStack_e8 = (code *)0x1b6907;
  connection_poll_cb_cold_9();
LAB_001b6907:
  pcStack_e8 = (code *)0x1b6914;
  connection_poll_cb_cold_4();
switchD_001b640c_default:
  pcStack_e8 = (code *)0x1b6919;
  connection_poll_cb_cold_5();
LAB_001b6919:
  pcStack_e8 = (code *)0x1b6926;
  connection_poll_cb_cold_13();
LAB_001b6926:
  pcStack_e8 = (code *)0x1b6933;
  connection_poll_cb_cold_7();
LAB_001b6933:
  pcStack_e8 = (code *)0x1b6940;
  connection_poll_cb_cold_14();
LAB_001b6940:
  pppppplVar6 = &ppppplStack_d8;
  pcStack_e8 = (code *)0x1b694d;
  connection_poll_cb_cold_8();
  pcVar11 = (char *)__n;
switchD_001b64e8_default:
  pcStack_e8 = (code *)0x1b6952;
  connection_poll_cb_cold_16();
LAB_001b6952:
  pcStack_e8 = close_socket;
  connection_poll_cb_cold_12();
  ppppplStack_f0 = (long *****)0x1b695d;
  pcStack_e8._0_4_ = extraout_EAX;
  iVar3 = close((int)pppppplVar6);
  if (iVar3 == 0) {
    return (uv_os_sock_t)pcStack_e8;
  }
  ppppplStack_f0 = (long *****)0x1b6966;
  piVar9 = __errno_location();
  if (*piVar9 == 0x68) {
    return (uv_os_sock_t)pcStack_e8;
  }
  ppppplStack_f0 = (long *****)delay_timer_cb;
  close_socket_cold_1();
  ppppplStack_f0 = (long *****)pcVar11;
  ppppplVar15 = *pppppplVar6;
  pcStack_108 = (code *)0x1b697f;
  iVar3 = uv_is_active();
  lStack_f8 = (long)iVar3;
  uStack_100 = 0;
  if (lStack_f8 == 0) {
    if (*(uint *)(ppppplVar15 + 0x25) == 0) goto LAB_001b69f5;
    uVar2 = *(uint *)(ppppplVar15 + 0x25) | *(uint *)((long)ppppplVar15 + 0x124);
    *(uint *)((long)ppppplVar15 + 0x124) = uVar2;
    *(undefined4 *)(ppppplVar15 + 0x25) = 0;
    pcStack_108 = (code *)0x1b69c8;
    iVar3 = uv_poll_start(ppppplVar15,uVar2,connection_poll_cb);
    lStack_f8 = (long)iVar3;
    uStack_100 = 0;
    if (lStack_f8 == 0) {
      return iVar3;
    }
  }
  else {
    pcStack_108 = (code *)0x1b69f5;
    delay_timer_cb_cold_1();
LAB_001b69f5:
    pcStack_108 = (code *)0x1b69fa;
    delay_timer_cb_cold_3();
  }
  plVar13 = &lStack_f8;
  pcStack_108 = connection_close_cb;
  delay_timer_cb_cold_2();
  ppcVar14 = (code **)*plVar13;
  piVar9 = (int *)((long)ppcVar14 + 0x114);
  *piVar9 = *piVar9 + -1;
  if (*piVar9 != 0) {
    return extraout_EAX_00;
  }
  if ((test_mode == '\x01') && (*(int *)(ppcVar14 + 0x22) == 0)) {
    pcStack_108 = ppcVar14[0x20];
    if (ppcVar14[0x20] != (code *)0x0) {
      connection_close_cb_cold_2();
LAB_001b6af8:
      connection_close_cb_cold_1();
      goto LAB_001b6b07;
    }
  }
  else {
    pcStack_108 = ppcVar14[0x20];
    if (ppcVar14[0x20] != (code *)0x10000) goto LAB_001b6af8;
  }
  if ((test_mode != '\0') && (*(int *)(ppcVar14 + 0x22) != 0)) {
    pcStack_108 = ppcVar14[0x21];
    if (pcStack_108 == (code *)0x0) goto LAB_001b6ab5;
    ppcVar14 = &pcStack_108;
    connection_close_cb_cold_3();
  }
  pcStack_108 = ppcVar14[0x21];
  if (pcStack_108 != (code *)0x10000) {
LAB_001b6b07:
    ppcVar14 = &pcStack_108;
    connection_close_cb_cold_4();
    free(*ppcVar14);
    return extraout_EAX_02;
  }
LAB_001b6ab5:
  closed_connections = closed_connections + 1;
  free(ppcVar14);
  return extraout_EAX_01;
code_r0x001b65b8:
  pcStack_e8 = (code *)0x1b65bd;
  piVar9 = __errno_location();
  if (*piVar9 == 4) goto LAB_001b659a;
LAB_001b65c2:
  if (0 < (int)uVar10) {
    pppppplVar1[0x20] = (long *****)((long)pppppplVar1[0x20] + (ulong)(uVar10 & 0x7fffffff));
    goto LAB_001b659a;
  }
  if (uVar10 != 0) {
    pcStack_e8 = (code *)0x1b65dc;
    piVar9 = __errno_location();
    if ((*piVar9 == 0xb) || (*piVar9 == 0x73)) goto switchD_001b640c_caseD_4;
    pcStack_e8 = (code *)0x1b65f5;
    connection_poll_cb_cold_3();
  }
LAB_001b65f5:
  *(undefined4 *)(pppppplVar1 + 0x23) = 1;
  uVar2 = uVar2 & 0xfffffffe;
  goto switchD_001b640c_caseD_4;
}

Assistant:

static uv_os_sock_t create_bound_socket (struct sockaddr_in bind_addr) {
  uv_os_sock_t sock;
  int r;

  sock = socket(AF_INET, SOCK_STREAM, IPPROTO_IP);
#ifdef _WIN32
  ASSERT_NE(sock, INVALID_SOCKET);
#else
  ASSERT_GE(sock, 0);
#endif

#ifndef _WIN32
  {
    /* Allow reuse of the port. */
    int yes = 1;
    r = setsockopt(sock, SOL_SOCKET, SO_REUSEADDR, &yes, sizeof yes);
    ASSERT_OK(r);
  }
#endif

  r = bind(sock, (const struct sockaddr*) &bind_addr, sizeof bind_addr);
  ASSERT_OK(r);

  return sock;
}